

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,TPZMatrix<long_double> *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  long *in_RSI;
  TPZRegisterClassId *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  unkbyte10 in_ST7;
  int64_t c;
  int64_t r;
  longdouble *dst;
  int64_t size;
  char *in_stack_00000178;
  char *in_stack_00000180;
  undefined6 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff86;
  void **in_stack_ffffffffffffff88;
  long lVar5;
  TPZMatrix<long_double> *in_stack_ffffffffffffff90;
  long local_50;
  long local_48;
  unkbyte10 *local_40;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSFMatrix<long_double>>(in_RDI,0x21);
  TPZMatrix<long_double>::TPZMatrix
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             (TPZMatrix<long_double> *)CONCAT26(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
            );
  *(undefined ***)in_RDI = &PTR__TPZSFMatrix_0242a420;
  uVar2 = (**(code **)(*(long *)in_RDI + 600))();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 0x20) = pvVar3;
  if (*(long *)(in_RDI + 0x20) == 0) {
    TPZMatrix<long_double>::Error(in_stack_00000180,in_stack_00000178);
  }
  local_40 = *(unkbyte10 **)(in_RDI + 0x20);
  local_48 = 0;
  while( true ) {
    lVar5 = local_48;
    lVar4 = (**(code **)(*(long *)in_RDI + 0x60))();
    if (lVar4 <= lVar5) break;
    for (local_50 = 0; local_50 <= local_48; local_50 = local_50 + 1) {
      (**(code **)(*in_RSI + 0x120))(in_RSI,local_48,local_50);
      *local_40 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      local_40 = local_40 + 1;
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const  TPZMatrix<TVar>  &A )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar> ( A )
{
    int64_t size = Size();
	fElem = new TVar[size] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Copia a matriz
	TVar *dst = fElem;
	for ( int64_t r = 0; r < this->Dim(); r++ )
		for ( int64_t c = 0; c <= r; c++ )
			*dst++ = A.GetVal( r, c );
}